

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

int hwnet::http::HttpSession::on_headers_complete(http_parser *parser)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *packet;
  __weak_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2> *__r;
  long lVar1;
  mapped_type *pmVar2;
  HttpRequest *this;
  HttpResponse *pHVar3;
  HttpPacket *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<hwnet::http::HttpSession> local_68;
  shared_ptr<hwnet::http::HttpPacket> local_58;
  undefined1 local_48 [8];
  Ptr req;
  Ptr resp;
  
  __r = (__weak_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2> *)parser->data;
  packet = &__r[9]._M_refcount;
  p_Var4 = __r[9]._M_refcount._M_pi;
  lVar1._0_4_ = p_Var4[8]._M_use_count;
  lVar1._4_4_ = p_Var4[8]._M_weak_count;
  if (lVar1 != 0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(p_Var4 + 5),(key_type *)(p_Var4 + 8));
    std::__cxx11::string::_M_assign((string *)pmVar2);
    p_Var4 = packet->_M_pi;
    p_Var4[8]._M_use_count = 0;
    p_Var4[8]._M_weak_count = 0;
    *(undefined1 *)p_Var4[8]._vptr__Sp_counted_base = 0;
    p_Var4 = packet->_M_pi;
    p_Var4[10]._M_use_count = 0;
    p_Var4[10]._M_weak_count = 0;
    *(undefined1 *)p_Var4[10]._vptr__Sp_counted_base = 0;
    p_Var4 = packet->_M_pi;
  }
  *(unsigned_short *)&p_Var4->_M_use_count = parser->http_major;
  *(unsigned_short *)((long)&p_Var4->_M_use_count + 2) = parser->http_minor;
  if (*(int *)&__r[9]._M_ptr == 2) {
    this = (HttpRequest *)operator_new(0x30);
    req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    resp.super___shared_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    HttpRequest::HttpRequest
              (this,(shared_ptr<hwnet::http::HttpSession> *)
                    &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,(shared_ptr<hwnet::http::HttpPacket> *)packet);
    std::__shared_ptr<hwnet::http::HttpRequest,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpRequest,void>
              ((__shared_ptr<hwnet::http::HttpRequest,(__gnu_cxx::_Lock_policy)2> *)local_48,this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&resp);
    pHVar3 = (HttpResponse *)operator_new(0x30);
    std::__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpSession,void>
              ((__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2> *)&local_68,__r);
    this_00 = (HttpPacket *)operator_new(0xe0);
    HttpPacket::HttpPacket(this_00);
    std::__shared_ptr<hwnet::http::HttpPacket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpPacket,void>
              ((__shared_ptr<hwnet::http::HttpPacket,(__gnu_cxx::_Lock_policy)2> *)&local_58,this_00
              );
    HttpResponse::HttpResponse(pHVar3,&local_68,&local_58);
    std::__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpResponse,void>
              ((__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2> *)
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pHVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
    ::operator()((function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
                  *)&__r[10]._M_refcount,(shared_ptr<hwnet::http::HttpRequest> *)local_48,
                 (shared_ptr<hwnet::http::HttpResponse> *)
                 &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&resp);
  }
  else {
    pHVar3 = (HttpResponse *)operator_new(0x30);
    std::__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpSession,void>
              ((__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2> *)
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,__r);
    HttpResponse::HttpResponse
              (pHVar3,(shared_ptr<hwnet::http::HttpSession> *)
                      &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<hwnet::http::HttpPacket> *)packet);
    std::__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpResponse,void>
              ((__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2> *)local_48,pHVar3
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&resp);
    std::function<void_(std::shared_ptr<hwnet::http::HttpResponse>_&)>::operator()
              ((function<void_(std::shared_ptr<hwnet::http::HttpResponse>_&)> *)
               &__r[0xc]._M_refcount,(shared_ptr<hwnet::http::HttpResponse> *)local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&req);
  return 0;
}

Assistant:

int HttpSession::on_headers_complete(http_parser *parser) {
	auto session = (HttpSession*)parser->data;
	if(!session->packet->field.empty()) {
		session->packet->headers[session->packet->field] = session->packet->value;
		session->packet->field.clear();
		session->packet->value.clear();
	}

	session->packet->http_major = parser->http_major;
	session->packet->http_minor = parser->http_minor;

	if(session->side == ServerSide) {
		auto req = HttpRequest::Ptr(new HttpRequest(nullptr,session->packet));
		auto resp = HttpResponse::Ptr(new HttpResponse(session->my_shared_from_this(),std::shared_ptr<HttpPacket>(new HttpPacket)));
		session->onRequest(req,resp);
	} else {
		auto resp = HttpResponse::Ptr(new HttpResponse(session->my_shared_from_this(),session->packet));
		session->onResponse(resp);		
	}
	
	return 0;
}